

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

xmlParserCtxtPtr xmlNewSAXParserCtxt(xmlSAXHandler *sax,void *userData)

{
  int iVar1;
  xmlParserCtxtPtr ctxt;
  void *userData_local;
  xmlSAXHandler *sax_local;
  
  sax_local = (xmlSAXHandler *)(*xmlMalloc)(0x2f0);
  if ((xmlParserCtxtPtr)sax_local == (xmlParserCtxtPtr)0x0) {
    xmlErrMemory((xmlParserCtxtPtr)0x0,"cannot allocate parser context\n");
    sax_local = (xmlSAXHandler *)0x0;
  }
  else {
    memset(sax_local,0,0x2f0);
    iVar1 = xmlInitSAXParserCtxt((xmlParserCtxtPtr)sax_local,sax,userData);
    if (iVar1 < 0) {
      xmlFreeParserCtxt((xmlParserCtxtPtr)sax_local);
      sax_local = (xmlSAXHandler *)0x0;
    }
  }
  return (xmlParserCtxtPtr)sax_local;
}

Assistant:

xmlParserCtxtPtr
xmlNewSAXParserCtxt(const xmlSAXHandler *sax, void *userData)
{
    xmlParserCtxtPtr ctxt;

    ctxt = (xmlParserCtxtPtr) xmlMalloc(sizeof(xmlParserCtxt));
    if (ctxt == NULL) {
	xmlErrMemory(NULL, "cannot allocate parser context\n");
	return(NULL);
    }
    memset(ctxt, 0, sizeof(xmlParserCtxt));
    if (xmlInitSAXParserCtxt(ctxt, sax, userData) < 0) {
        xmlFreeParserCtxt(ctxt);
	return(NULL);
    }
    return(ctxt);
}